

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O2

type dlib::assign_pixel_helpers::assign<dlib::hsi_pixel,dlib::rgb_pixel>
               (hsi_pixel *dest,rgb_pixel *src)

{
  ushort uVar1;
  COLOUR c1;
  undefined1 auVar2 [16];
  double local_28;
  double local_20;
  double local_18;
  
  uVar1._0_1_ = src->red;
  uVar1._1_1_ = src->green;
  auVar2._0_8_ = (double)(uVar1 & 0xff);
  auVar2._8_8_ = (double)(byte)uVar1._1_1_;
  auVar2 = divpd(auVar2,_DAT_002df980);
  c1.b = (double)src->blue / 255.0;
  c1.r = (double)auVar2._0_8_;
  c1.g = (double)auVar2._8_8_;
  RGB2HSL(c1);
  dest->h = (uchar)(int)((local_28 / 360.0) * 255.0 + 0.5);
  dest->s = (uchar)(int)(local_20 * 255.0 + 0.5);
  dest->i = (uchar)(int)(local_18 * 255.0 + 0.5);
  return;
}

Assistant:

typename enable_if_c<pixel_traits<P1>::hsi && pixel_traits<P2>::rgb>::type
        assign(P1& dest, const P2& src) 
        { 
            COLOUR c1;
            HSL c2;
            c1.r = src.red/255.0;
            c1.g = src.green/255.0;
            c1.b = src.blue/255.0;
            c2 = RGB2HSL(c1);

            dest.h = static_cast<unsigned char>(c2.h/360.0*255.0 + 0.5);
            dest.s = static_cast<unsigned char>(c2.s*255.0 + 0.5);
            dest.i = static_cast<unsigned char>(c2.l*255.0 + 0.5);
        }